

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

Vec_Int_t * Dau_DecFindSets(word *pInit,int nVars)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  ulong uVar3;
  int *pSched [16];
  int *local_a8 [17];
  
  local_a8[0xe] = (int *)0x0;
  local_a8[0xf] = (int *)0x0;
  local_a8[0xc] = (int *)0x0;
  local_a8[0xd] = (int *)0x0;
  local_a8[10] = (int *)0x0;
  local_a8[0xb] = (int *)0x0;
  local_a8[8] = (int *)0x0;
  local_a8[9] = (int *)0x0;
  local_a8[6] = (int *)0x0;
  local_a8[7] = (int *)0x0;
  local_a8[4] = (int *)0x0;
  local_a8[5] = (int *)0x0;
  local_a8[2] = (int *)0x0;
  local_a8[3] = (int *)0x0;
  local_a8[0] = (int *)0x0;
  local_a8[1] = (int *)0x0;
  if (nVars < 3) {
    pVVar2 = Dau_DecFindSets_int(pInit,nVars,local_a8);
  }
  else {
    uVar3 = 2;
    do {
      piVar1 = Extra_GreyCodeSchedule((int)uVar3);
      local_a8[uVar3] = piVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)nVars != uVar3);
    pVVar2 = Dau_DecFindSets_int(pInit,nVars,local_a8);
    if (2 < nVars) {
      uVar3 = 2;
      do {
        if (local_a8[uVar3] != (int *)0x0) {
          free(local_a8[uVar3]);
          local_a8[uVar3] = (int *)0x0;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)nVars != uVar3);
    }
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Dau_DecFindSets( word * pInit, int nVars )
{
    Vec_Int_t * vSets;
    int v, * pSched[16] = {NULL};
    for ( v = 2; v < nVars; v++ )
        pSched[v] = Extra_GreyCodeSchedule( v );
    vSets = Dau_DecFindSets_int( pInit, nVars, pSched );
    for ( v = 2; v < nVars; v++ )
        ABC_FREE( pSched[v] );
    return vSets;
}